

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

bool __thiscall GrcSymbolTableEntry::IsMovement(GrcSymbolTableEntry *this)

{
  bool bVar1;
  
  do {
    bVar1 = std::operator==(&this->m_staFieldName,"shift");
    if (bVar1) {
      return true;
    }
    bVar1 = std::operator==(&this->m_staFieldName,"kern");
    if (bVar1) {
      return true;
    }
    bVar1 = std::operator==(&this->m_staFieldName,"advance");
    if (bVar1) {
      return true;
    }
    this = this->m_psymtbl->m_psymParent;
  } while (this != (Symbol)0x0);
  return false;
}

Assistant:

bool GrcSymbolTableEntry::IsMovement()
{
	if (m_staFieldName == "shift")
		return true;
	if (m_staFieldName == "kern")
		return true;
	if (m_staFieldName == "advance")
		return true;
	Symbol psymParent = ParentSymbol();
	if (!psymParent)
		return false;
	return (psymParent->IsMovement());
}